

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O0

void __thiscall PathBuilder::write_out(PathBuilder *this,ostream *out)

{
  bool bVar1;
  _Setprecision _Var2;
  reference this_00;
  reference pPVar3;
  ostream *poVar4;
  const_reference this_01;
  const_reference b;
  Point *point;
  const_iterator __end2;
  const_iterator __begin2;
  deque<Point,_std::allocator<Point>_> *__range2;
  int count;
  deque<Point,_std::allocator<Point>_> *path;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
  *__range1;
  ostream *out_local;
  PathBuilder *this_local;
  
  __end1 = std::
           vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
           ::begin(&this->paths);
  path = (deque<Point,_std::allocator<Point>_> *)
         std::
         vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
         ::end(&this->paths);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::deque<Point,_std::allocator<Point>_>_*,_std::vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>_>
                                     *)&path), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<const_std::deque<Point,_std::allocator<Point>_>_*,_std::vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>_>
              ::operator*(&__end1);
    bVar1 = std::deque<Point,_std::allocator<Point>_>::empty(this_00);
    if (!bVar1) {
      _Var2 = std::setprecision(4);
      std::operator<<(out,_Var2);
      std::operator<<(out,"<path d=\"M");
      __range2._0_4_ = 0;
      std::deque<Point,_std::allocator<Point>_>::begin((const_iterator *)&__end2._M_node,this_00);
      std::deque<Point,_std::allocator<Point>_>::end((const_iterator *)&point,this_00);
      while (bVar1 = std::operator!=((_Self *)&__end2._M_node,(_Self *)&point), bVar1) {
        pPVar3 = std::_Deque_iterator<Point,_const_Point_&,_const_Point_*>::operator*
                           ((_Deque_iterator<Point,_const_Point_&,_const_Point_*> *)&__end2._M_node)
        ;
        if ((int)__range2 == 1) {
          std::operator<<(out,"L");
        }
        poVar4 = (ostream *)std::ostream::operator<<(out,pPVar3->x);
        poVar4 = std::operator<<(poVar4," ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,pPVar3->y);
        std::operator<<(poVar4," ");
        __range2._0_4_ = (int)__range2 + 1;
        std::_Deque_iterator<Point,_const_Point_&,_const_Point_*>::operator++
                  ((_Deque_iterator<Point,_const_Point_&,_const_Point_*> *)&__end2._M_node);
      }
      this_01 = std::deque<Point,_std::allocator<Point>_>::front(this_00);
      b = std::deque<Point,_std::allocator<Point>_>::back(this_00);
      bVar1 = Point::operator==(this_01,b);
      if (bVar1) {
        std::operator<<(out," Z");
      }
      std::operator<<(out,"\" />\n");
    }
    __gnu_cxx::
    __normal_iterator<const_std::deque<Point,_std::allocator<Point>_>_*,_std::vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void PathBuilder::write_out(std::ostream &out) const {
    for (const auto &path : paths) {
        if (path.empty()) {
            continue;
        }
        out << std::setprecision(4);
        out<<"<path d=\"M";
        int count = 0;
        for (const auto &point : path) {
            if (count == 1) {
                out<<"L";
            }
            out<<point.x<<" "<<point.y<<" ";
            count++;
        }
        if (path.front() == path.back()) {
            out<<" Z";
        }
        out<<"\" />\n";
    }
}